

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SF_ASCII85Decode.hh
# Opt level: O0

Pipeline * __thiscall SF_ASCII85Decode::getDecodePipeline(SF_ASCII85Decode *this,Pipeline *next)

{
  element_type *peVar1;
  shared_ptr<Pl_ASCII85Decoder> local_28;
  Pipeline *local_18;
  Pipeline *next_local;
  SF_ASCII85Decode *this_local;
  
  local_18 = next;
  next_local = (Pipeline *)this;
  std::make_shared<Pl_ASCII85Decoder,char_const(&)[15],Pipeline*&>
            ((char (*) [15])&local_28,(Pipeline **)"ascii85 decode");
  std::shared_ptr<Pipeline>::operator=(&this->pipeline,&local_28);
  std::shared_ptr<Pl_ASCII85Decoder>::~shared_ptr(&local_28);
  peVar1 = std::__shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>::get
                     (&(this->pipeline).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>);
  return peVar1;
}

Assistant:

Pipeline*
    getDecodePipeline(Pipeline* next) override
    {
        this->pipeline = std::make_shared<Pl_ASCII85Decoder>("ascii85 decode", next);
        return this->pipeline.get();
    }